

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

char * __thiscall
ImFont::CalcWordWrapPositionA(ImFont *this,float scale,char *text,char *text_end,float wrap_width)

{
  uint *puVar1;
  bool bVar2;
  uint c_00;
  int iVar3;
  uint *in_RDX;
  uint *in_RSI;
  int *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float char_width;
  char *next_s;
  uint c;
  char *s;
  bool inside_word;
  char *prev_word_end;
  char *word_end;
  float blank_width;
  float word_width;
  float line_width;
  uint *local_88;
  bool local_7d;
  float local_7c;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  uint *in_stack_ffffffffffffffa0;
  uint *local_50;
  bool local_41;
  uint *local_40;
  uint *local_38;
  float local_30;
  float local_2c;
  float local_28;
  
  local_28 = 0.0;
  local_2c = 0.0;
  local_30 = 0.0;
  local_40 = (uint *)0x0;
  local_41 = true;
  puVar1 = in_RSI;
  local_38 = in_RSI;
LAB_001556d5:
  do {
    local_50 = puVar1;
    if (in_RDX <= local_50) {
      return (char *)local_50;
    }
    c_00 = (uint)(char)*local_50;
    if (c_00 < 0x80) {
      in_stack_ffffffffffffffa0 = (uint *)((long)local_50 + 1);
    }
    else {
      iVar3 = ImTextCharFromUtf8(in_stack_ffffffffffffffa0,
                                 (char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98),(char *)in_RDI);
      in_stack_ffffffffffffffa0 = (uint *)((long)local_50 + (long)iVar3);
    }
    if (c_00 == 0) {
      return (char *)local_50;
    }
    if (c_00 < 0x20) {
      if (c_00 == 10) {
        local_30 = 0.0;
        local_2c = 0.0;
        local_28 = 0.0;
        local_41 = true;
        puVar1 = in_stack_ffffffffffffffa0;
        goto LAB_001556d5;
      }
      puVar1 = in_stack_ffffffffffffffa0;
      if (c_00 == 0xd) goto LAB_001556d5;
    }
    if ((int)c_00 < *in_RDI) {
      local_7c = *(float *)(*(long *)(in_RDI + 2) + (ulong)c_00 * 4);
    }
    else {
      local_7c = (float)in_RDI[4];
    }
    bVar2 = ImCharIsBlankW(c_00);
    if (bVar2) {
      if (local_41) {
        local_28 = local_30 + local_28;
        local_30 = 0.0;
        local_38 = local_50;
      }
      local_30 = local_7c + local_30;
      local_41 = false;
    }
    else {
      local_2c = local_7c + local_2c;
      puVar1 = in_stack_ffffffffffffffa0;
      if (!local_41) {
        local_40 = local_38;
        local_28 = local_2c + local_30 + local_28;
        local_30 = 0.0;
        local_2c = 0.0;
        puVar1 = local_38;
      }
      local_38 = puVar1;
      local_7d = false;
      if ((((c_00 != 0x2e) && (local_7d = false, c_00 != 0x2c)) && (local_7d = false, c_00 != 0x3b))
         && ((local_7d = false, c_00 != 0x21 && (local_7d = false, c_00 != 0x3f)))) {
        local_7d = c_00 != 0x22;
      }
      local_41 = local_7d;
    }
    in_stack_ffffffffffffff9c = local_7c;
    puVar1 = in_stack_ffffffffffffffa0;
    if (in_XMM1_Da / in_XMM0_Da < local_28 + local_2c) {
      if (local_2c < in_XMM1_Da / in_XMM0_Da) {
        if (local_40 == (uint *)0x0) {
          local_88 = local_38;
        }
        else {
          local_88 = local_40;
        }
        local_50 = local_88;
      }
      return (char *)local_50;
    }
  } while( true );
}

Assistant:

const char* ImFont::CalcWordWrapPositionA(float scale, const char* text, const char* text_end, float wrap_width) const
{
    // Simple word-wrapping for English, not full-featured. Please submit failing cases!
    // FIXME: Much possible improvements (don't cut things like "word !", "word!!!" but cut within "word,,,,", more sensible support for punctuations, support for Unicode punctuations, etc.)

    // For references, possible wrap point marked with ^
    //  "aaa bbb, ccc,ddd. eee   fff. ggg!"
    //      ^    ^    ^   ^   ^__    ^    ^

    // List of hardcoded separators: .,;!?'"

    // Skip extra blanks after a line returns (that includes not counting them in width computation)
    // e.g. "Hello    world" --> "Hello" "World"

    // Cut words that cannot possibly fit within one line.
    // e.g.: "The tropical fish" with ~5 characters worth of width --> "The tr" "opical" "fish"

    float line_width = 0.0f;
    float word_width = 0.0f;
    float blank_width = 0.0f;
    wrap_width /= scale; // We work with unscaled widths to avoid scaling every characters

    const char* word_end = text;
    const char* prev_word_end = NULL;
    bool inside_word = true;

    const char* s = text;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)*s;
        const char* next_s;
        if (c < 0x80)
            next_s = s + 1;
        else
            next_s = s + ImTextCharFromUtf8(&c, s, text_end);
        if (c == 0)
            break;

        if (c < 32)
        {
            if (c == '\n')
            {
                line_width = word_width = blank_width = 0.0f;
                inside_word = true;
                s = next_s;
                continue;
            }
            if (c == '\r')
            {
                s = next_s;
                continue;
            }
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX);
        if (ImCharIsBlankW(c))
        {
            if (inside_word)
            {
                line_width += blank_width;
                blank_width = 0.0f;
                word_end = s;
            }
            blank_width += char_width;
            inside_word = false;
        }
        else
        {
            word_width += char_width;
            if (inside_word)
            {
                word_end = next_s;
            }
            else
            {
                prev_word_end = word_end;
                line_width += word_width + blank_width;
                word_width = blank_width = 0.0f;
            }

            // Allow wrapping after punctuation.
            inside_word = (c != '.' && c != ',' && c != ';' && c != '!' && c != '?' && c != '\"');
        }

        // We ignore blank width at the end of the line (they can be skipped)
        if (line_width + word_width > wrap_width)
        {
            // Words that cannot possibly fit within an entire line will be cut anywhere.
            if (word_width < wrap_width)
                s = prev_word_end ? prev_word_end : word_end;
            break;
        }

        s = next_s;
    }

    return s;
}